

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O0

void __thiscall xr_entity_factory::~xr_entity_factory(xr_entity_factory *this)

{
  xr_ini_file *this_00;
  xr_entity_factory *this_local;
  
  this_00 = this->m_system_ini;
  if (this_00 != (xr_ini_file *)0x0) {
    xray_re::xr_ini_file::~xr_ini_file(this_00);
    operator_delete(this_00,0x18);
  }
  xray_re::delete_elements<std::vector<factory_item_base*,std::allocator<factory_item_base*>>>
            (&this->m_clsids);
  std::vector<factory_item_base_*,_std::allocator<factory_item_base_*>_>::~vector(&this->m_clsids);
  return;
}

Assistant:

xr_entity_factory::~xr_entity_factory()
{
	delete m_system_ini;
	delete_elements(m_clsids);
}